

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

cupdlp_retcode PDHG_Solve(CUPDLPwork *pdhg)

{
  int iVar1;
  CUPDLPproblem *pCVar2;
  CUPDLPsettings *pCVar3;
  CUPDLPresobj *pCVar4;
  CUPDLPtimers *pCVar5;
  CUPDLPscaling *pCVar6;
  CUPDLPvec *pCVar7;
  CUPDLPvec *pCVar8;
  cupdlp_bool cVar9;
  cupdlp_retcode cVar10;
  uint uVar11;
  termination_code tVar12;
  CUPDLPwork *in_RDI;
  double dVar13;
  int full_print_1;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  int termination_print;
  int full_print;
  int bool_print;
  int bool_checking;
  int iter_log_since_header;
  int iter_log_between_header;
  CUPDLPscaling *scaling;
  CUPDLPtimers *timers;
  CUPDLPiterates *iterates;
  CUPDLPresobj *resobj;
  CUPDLPsettings *settings;
  CUPDLPstepsize *stepsize;
  CUPDLPproblem *problem;
  cupdlp_retcode retcode;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  CUPDLPiterates *in_stack_ffffffffffffff50;
  CUPDLPiterates *work;
  undefined8 in_stack_ffffffffffffff58;
  CUPDLPwork *in_stack_ffffffffffffff60;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  byte bVar17;
  undefined1 uVar18;
  undefined4 in_stack_ffffffffffffff74;
  CUPDLPwork *in_stack_ffffffffffffff80;
  CUPDLPvec *pCVar19;
  CUPDLPwork *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_50;
  CUPDLPiterates *pCVar20;
  cupdlp_retcode local_c;
  
  local_c = 0;
  pCVar2 = in_RDI->problem;
  pCVar3 = in_RDI->settings;
  pCVar4 = in_RDI->resobj;
  work = in_RDI->iterates;
  pCVar5 = in_RDI->timers;
  pCVar6 = in_RDI->scaling;
  pCVar5->nIter = 0;
  dVar13 = getTimeStamp();
  pCVar5->dSolvingBeg = dVar13;
  PDHG_Init_Data(in_RDI);
  cVar10 = PDHG_Init_Step_Sizes(in_stack_ffffffffffffff80);
  if (cVar10 == 0) {
    PDHG_Init_Variables((CUPDLPwork *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
    ;
    local_50 = 0x32;
    pCVar5->nIter = 0;
    while (pCVar5->nIter < pCVar3->nIterLim) {
      PDHG_Compute_SolvingTime
                ((CUPDLPwork *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      uVar18 = true;
      if ((9 < pCVar5->nIter) && (uVar18 = true, pCVar5->nIter != pCVar3->nIterLim + -1)) {
        uVar18 = pCVar3->dTimeLim <= pCVar5->dSolvingTime &&
                 pCVar5->dSolvingTime != pCVar3->dTimeLim;
      }
      bVar17 = 1;
      if ((bool)uVar18 == false) {
        bVar17 = pCVar5->nIter % 0x28 != 0 ^ 0xff;
      }
      if ((((bVar17 & 1) == 0) ||
          (uVar16 = true, pCVar5->nIter % (pCVar3->nLogInterval * 0x28) != 0)) &&
         (uVar16 = true, pCVar5->nIter != pCVar3->nIterLim + -1)) {
        uVar16 = pCVar3->dTimeLim <= pCVar5->dSolvingTime &&
                 pCVar5->dSolvingTime != pCVar3->dTimeLim;
      }
      uVar15 = 0 < in_RDI->settings->nLogLevel && (bool)uVar16 != false;
      uVar11 = (uint)(1 < in_RDI->settings->nLogLevel);
      if ((bVar17 & 1) != 0) {
        uVar14 = uVar15;
        PDHG_Compute_Average_Iterate
                  ((CUPDLPwork *)
                   CONCAT44(in_stack_ffffffffffffff74,
                            CONCAT13(uVar18,CONCAT12(bVar17,CONCAT11(uVar16,uVar15)))));
        PDHG_Compute_Residuals((CUPDLPwork *)work);
        PDHG_Compute_Infeas_Residuals(in_stack_ffffffffffffff90);
        if ((bool)uVar15) {
          if ((uVar11 != 0) || (local_50 == 0x32)) {
            PDHG_Print_Header((CUPDLPwork *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            local_50 = 0;
          }
          if (uVar11 != 0) {
            PDHG_Print_Iter((CUPDLPwork *)in_stack_ffffffffffffff50);
          }
          PDHG_Print_Iter_Average((CUPDLPwork *)in_stack_ffffffffffffff50);
          local_50 = local_50 + 1;
        }
        uVar15 = uVar14;
        cVar9 = PDHG_Check_Termination
                          (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                          );
        if (cVar9) {
          pCVar4->termIterate = LAST_ITERATE;
          pCVar4->termCode = OPTIMAL;
          break;
        }
        if ((in_RDI->settings->iInfNormAbsLocalTermination == 0) &&
           (cVar9 = PDHG_Check_Termination_Average
                              (in_stack_ffffffffffffff60,
                               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20)), cVar9)) {
          iVar1 = in_RDI->timers->nIter;
          pCVar7 = work->y[iVar1 % 2];
          pCVar19 = work->ax[iVar1 % 2];
          pCVar8 = work->aty[iVar1 % 2];
          pCVar20 = work;
          memcpy(work->x[iVar1 % 2]->data,work->xAverage->data,(long)pCVar2->nCols << 3);
          memcpy(pCVar7->data,pCVar20->yAverage->data,(long)pCVar2->nRows << 3);
          memcpy(pCVar19->data,pCVar20->axAverage->data,(long)pCVar2->nRows << 3);
          memcpy(pCVar8->data,pCVar20->atyAverage->data,(long)pCVar2->nCols << 3);
          memcpy(pCVar4->dSlackPos,pCVar4->dSlackPosAverage,(long)pCVar2->nCols << 3);
          memcpy(pCVar4->dSlackNeg,pCVar4->dSlackNegAverage,(long)pCVar2->nCols << 3);
          pCVar4->termIterate = AVERAGE_ITERATE;
          pCVar4->termCode = OPTIMAL;
          in_stack_ffffffffffffff50 = work;
          break;
        }
        tVar12 = PDHG_Check_Infeasibility
                           ((CUPDLPwork *)in_stack_ffffffffffffff50,
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (tVar12 == INFEASIBLE_OR_UNBOUNDED) {
          pCVar4->termCode = INFEASIBLE_OR_UNBOUNDED;
          break;
        }
        if (pCVar3->dTimeLim <= pCVar5->dSolvingTime && pCVar5->dSolvingTime != pCVar3->dTimeLim) {
          pCVar4->termCode = TIMELIMIT_OR_ITERLIMIT;
          break;
        }
        if (pCVar3->nIterLim + -1 <= pCVar5->nIter) {
          pCVar4->termCode = TIMELIMIT_OR_ITERLIMIT;
          break;
        }
        PDHG_Restart_Iterate
                  ((CUPDLPwork *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
      cVar10 = PDHG_Update_Iterate((CUPDLPwork *)
                                   CONCAT44(in_stack_ffffffffffffff74,
                                            CONCAT13(uVar18,CONCAT12(bVar17,CONCAT11(uVar16,uVar15))
                                                    )));
      if (cVar10 == 1) {
        pCVar4->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }
      pCVar5->nIter = pCVar5->nIter + 1;
    }
    if (0 < in_RDI->settings->nLogLevel) {
      if (1 < in_RDI->settings->nLogLevel) {
        PDHG_Print_Header((CUPDLPwork *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        PDHG_Print_Iter((CUPDLPwork *)in_stack_ffffffffffffff50);
      }
      PDHG_Print_Iter_Average((CUPDLPwork *)in_stack_ffffffffffffff50);
    }
    if (0 < in_RDI->settings->nLogLevel) {
      printf("\n");
      printf("%-27s ","Solving information:");
      tVar12 = pCVar4->termCode;
      if (tVar12 == OPTIMAL) {
        if (pCVar4->termIterate == LAST_ITERATE) {
          printf("Optimal current solution.\n");
        }
        else if (pCVar4->termIterate == AVERAGE_ITERATE) {
          printf("Optimal average solution.\n");
        }
      }
      else if (tVar12 == INFEASIBLE_OR_UNBOUNDED) {
        if ((pCVar4->primalCode == INFEASIBLE) && (pCVar4->dualCode == FEASIBLE)) {
          printf("Infeasible or unbounded: primal infeasible.");
        }
        else if ((pCVar4->primalCode == FEASIBLE) && (pCVar4->dualCode == INFEASIBLE)) {
          printf("Infeasible or unbounded: dual infeasible.");
        }
        else {
          printf("Infeasible or unbounded: both primal and dual infeasible.");
        }
        if (pCVar4->termInfeasIterate == LAST_ITERATE) {
          printf(" [L]\n");
        }
        else if (pCVar4->termInfeasIterate == AVERAGE_ITERATE) {
          printf(" [A]\n");
        }
      }
      else if (tVar12 == TIMELIMIT_OR_ITERLIMIT) {
        if (pCVar5->dSolvingTime < pCVar3->dTimeLim || pCVar5->dSolvingTime == pCVar3->dTimeLim) {
          if (pCVar3->nIterLim + -1 <= pCVar5->nIter) {
            printf("Iteration limit reached.\n");
          }
        }
        else {
          printf("Time limit reached.\n");
        }
      }
      else {
        printf("Unexpected.\n");
      }
      if ((pCVar4->termCode == OPTIMAL) && (pCVar4->termIterate == AVERAGE_ITERATE)) {
        printf("%27s %+15.8e\n",pCVar4->dPrimalObjAverage,"Primal objective:");
        printf("%27s %+15.8e\n",pCVar4->dDualObjAverage,"Dual objective:");
        printf("%27s %8.2e / %8.2e\n",pCVar4->dPrimalFeasAverage,
               SUB84(pCVar4->dPrimalFeasAverage / (pCVar6->dNormRhs + 1.0),0),
               "Primal infeas (abs/rel):");
        printf("%27s %8.2e / %8.2e\n",pCVar4->dDualFeasAverage,
               SUB84(pCVar4->dDualFeasAverage / (pCVar6->dNormCost + 1.0),0),
               "Dual infeas (abs/rel):");
        printf("%27s %8.2e / %8.2e\n",ABS(pCVar4->dDualityGapAverage),
               SUB84(pCVar4->dRelObjGapAverage,0),"Duality gap (abs/rel):");
      }
      else {
        printf("%27s %+15.8e\n",pCVar4->dPrimalObj,"Primal objective:");
        printf("%27s %+15.8e\n",pCVar4->dDualObj,"Dual objective:");
        printf("%27s %8.2e / %8.2e\n",pCVar4->dPrimalFeas,
               SUB84(pCVar4->dPrimalFeas / (pCVar6->dNormRhs + 1.0),0),"Primal infeas (abs/rel):");
        printf("%27s %8.2e / %8.2e\n",pCVar4->dDualFeas,
               SUB84(pCVar4->dDualFeas / (pCVar6->dNormCost + 1.0),0),"Dual infeas (abs/rel):");
        printf("%27s %8.2e / %8.2e\n",ABS(pCVar4->dDualityGap),SUB84(pCVar4->dRelObjGap,0),
               "Duality gap (abs/rel):");
      }
      printf("%27s %d\n","Number of iterations:",(ulong)(uint)pCVar5->nIter);
      printf("\n");
    }
    if (1 < in_RDI->settings->nLogLevel) {
      printf("Timing information:\n");
      printf("%21s %e in %d iterations\n",
             pCVar5->dSolvingTime + pCVar5->dScalingTime + pCVar5->dPresolveTime,"Total solver time"
             ,(ulong)(uint)pCVar5->nIter);
      printf("%21s %e in %d iterations\n",pCVar5->dSolvingTime,"Solve time",
             (ulong)(uint)pCVar5->nIter);
      printf("%21s %e \n",(double)pCVar5->nIter / pCVar5->dSolvingTime,"Iters per sec");
      printf("%21s %e\n",pCVar5->dScalingTime,"Scaling time");
      printf("%21s %e\n",pCVar5->dPresolveTime,"Presolve time");
      printf("%21s %e in %d calls\n",pCVar5->dAxTime,"Ax",(ulong)(uint)pCVar5->nAxCalls);
      printf("%21s %e in %d calls\n",pCVar5->dAtyTime,"Aty",(ulong)(uint)pCVar5->nAtyCalls);
      printf("%21s %e in %d calls\n",pCVar5->dComputeResidualsTime,"ComputeResiduals",
             (ulong)(uint)pCVar5->nComputeResidualsCalls);
      printf("%21s %e in %d calls\n",pCVar5->dUpdateIterateTime,"UpdateIterates",
             (ulong)(uint)pCVar5->nUpdateIterateCalls);
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

cupdlp_retcode PDHG_Solve(CUPDLPwork *pdhg) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPtimers *timers = pdhg->timers;
  CUPDLPscaling *scaling = pdhg->scaling;

  timers->nIter = 0;
  timers->dSolvingBeg = getTimeStamp();

  PDHG_Init_Data(pdhg);

  CUPDLP_CALL(PDHG_Init_Step_Sizes(pdhg));

  PDHG_Init_Variables(pdhg);

  // todo: translate check_data into cuda or do it on cpu
  // PDHG_Check_Data(pdhg);

  // PDHG_Print_Header(pdhg);

  // Repeat the iteration logging header periodically if logging style
  // is minimal (pdhg->settings->nLogLevel=1), initialising
  // iter_log_since_header so that an initial header is printed
  const int iter_log_between_header = 50;
  int iter_log_since_header = iter_log_between_header;
  for (timers->nIter = 0; timers->nIter < settings->nIterLim; ++timers->nIter) {
    PDHG_Compute_SolvingTime(pdhg);
#if CUPDLP_DUMP_ITERATES_STATS && CUPDLP_DEBUG
    PDHG_Dump_Stats(pdhg);
#endif
    int bool_checking = (timers->nIter < 10) ||
                        (timers->nIter == (settings->nIterLim - 1)) ||
                        (timers->dSolvingTime > settings->dTimeLim);
    int bool_print = 0;
#if CUPDLP_DEBUG
    bool_checking = (bool_checking || !(timers->nIter % CUPDLP_DEBUG_INTERVAL));
    bool_print = bool_checking;
#else
    bool_checking =
        (bool_checking || !(timers->nIter % CUPDLP_RELEASE_INTERVAL));
    bool_print =
        (bool_checking && !(timers->nIter % (CUPDLP_RELEASE_INTERVAL *
                                             settings->nLogInterval))) ||
        (timers->nIter == (settings->nIterLim - 1)) ||
        (timers->dSolvingTime > settings->dTimeLim);
    // Ensure that bool_print is false if the logging level has been
    // set to 0 via the HiGHS option
    bool_print = pdhg->settings->nLogLevel>0 && bool_print;
#endif
    // Full printing is false only if the logging level has been set
    // to 0 or 1 via the HiGHS option
    int full_print = pdhg->settings->nLogLevel >= 2;
    if (bool_checking) {
      PDHG_Compute_Average_Iterate(pdhg);
      PDHG_Compute_Residuals(pdhg);
      PDHG_Compute_Infeas_Residuals(pdhg);

      if (bool_print) {
	// With reduced printing, the header is only needed for the
	// first iteration since only average iteration printing is
	// carried out
        if (full_print ||
	    iter_log_since_header == iter_log_between_header) {
	  PDHG_Print_Header(pdhg);
	  iter_log_since_header = 0;
	}
        if (full_print) PDHG_Print_Iter(pdhg);
        PDHG_Print_Iter_Average(pdhg);
	iter_log_since_header++;
      }

      // Termination check printing is only done when printing is full
      int termination_print = bool_print && full_print;
      if (PDHG_Check_Termination(pdhg, termination_print)) {
        // cupdlp_printf("Optimal current solution.\n");
        resobj->termIterate = LAST_ITERATE;
        resobj->termCode = OPTIMAL;
        break;
      }

      // Don't allow "average" termination if
      // iInfNormAbsLocalTermination is set
      if (!pdhg->settings->iInfNormAbsLocalTermination &&
	  PDHG_Check_Termination_Average(pdhg, termination_print)) {
	// cupdlp_printf("Optimal average solution.\n");
	
    cupdlp_int iter = pdhg->timers->nIter;
    CUPDLPvec *x = iterates->x[iter % 2];
    CUPDLPvec *y = iterates->y[iter % 2];
    CUPDLPvec *ax = iterates->ax[iter % 2];
    CUPDLPvec *aty = iterates->aty[iter % 2];

    CUPDLP_COPY_VEC(x->data, iterates->xAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(y->data, iterates->yAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(ax->data, iterates->axAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(aty->data, iterates->atyAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(resobj->dSlackPos, resobj->dSlackPosAverage, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(resobj->dSlackNeg, resobj->dSlackNegAverage, cupdlp_float, problem->nCols);

	resobj->termIterate = AVERAGE_ITERATE;
	resobj->termCode = OPTIMAL;
	break;
      }

      if (PDHG_Check_Infeasibility(pdhg, 0) == INFEASIBLE_OR_UNBOUNDED) {
        // cupdlp_printf("Infeasible or unbounded.\n");
        // if (resobj->primalCode == INFEASIBLE && resobj->dualCode == FEASIBLE)
        // {
        //   resobj->dualCode = UNBOUNDED;
        // } else if (resobj->primalCode == FEASIBLE &&
        //            resobj->dualCode == INFEASIBLE) {
        //   resobj->primalCode = UNBOUNDED;
        // }
        // resobj->termCode = resobj->primalCode;
        resobj->termCode = INFEASIBLE_OR_UNBOUNDED;
        break;
      }

      if (timers->dSolvingTime > settings->dTimeLim) {
        // cupdlp_printf("Time limit reached.\n");
        resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }

      if (timers->nIter >= (settings->nIterLim - 1)) {
        // cupdlp_printf("Iteration limit reached.\n");
        resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }

      PDHG_Restart_Iterate(pdhg);
    }

    // CUPDLP_CALL(PDHG_Update_Iterate(pdhg));
    if (PDHG_Update_Iterate(pdhg) == RETCODE_FAILED) {
      // cupdlp_printf("Time limit reached.\n");
      resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
      break;
    }
  }

  // print at last
  if (pdhg->settings->nLogLevel>0) {
    int full_print = pdhg->settings->nLogLevel >= 2;
    if (full_print) {
      PDHG_Print_Header(pdhg);
      PDHG_Print_Iter(pdhg);
    }
    PDHG_Print_Iter_Average(pdhg);
  }

  if (pdhg->settings->nLogLevel>0) {
    cupdlp_printf("\n");
    cupdlp_printf("%-27s ", "Solving information:");

    switch (resobj->termCode) {
    case OPTIMAL:
      if (resobj->termIterate == LAST_ITERATE) {
        cupdlp_printf("Optimal current solution.\n");
      } else if (resobj->termIterate == AVERAGE_ITERATE) {
        cupdlp_printf("Optimal average solution.\n");
      }
      break;
    case TIMELIMIT_OR_ITERLIMIT:
      if (timers->dSolvingTime > settings->dTimeLim) {
        cupdlp_printf("Time limit reached.\n");
      } else if (timers->nIter >= (settings->nIterLim - 1)) {
        cupdlp_printf("Iteration limit reached.\n");
      }
      break;
    case INFEASIBLE_OR_UNBOUNDED:
      if (resobj->primalCode == INFEASIBLE && resobj->dualCode == FEASIBLE) {
        cupdlp_printf("Infeasible or unbounded: primal infeasible.");
      } else if (resobj->primalCode == FEASIBLE &&
                 resobj->dualCode == INFEASIBLE) {
        cupdlp_printf("Infeasible or unbounded: dual infeasible.");
      } else {
        cupdlp_printf(
		      "Infeasible or unbounded: both primal and dual infeasible.");
      }
      
      if (resobj->termInfeasIterate == LAST_ITERATE) {
        cupdlp_printf(" [L]\n");
      } else if (resobj->termInfeasIterate == AVERAGE_ITERATE) {
        cupdlp_printf(" [A]\n");
      }
      break;
    default:
      cupdlp_printf("Unexpected.\n");
      break;
    }

    if (resobj->termCode == OPTIMAL && resobj->termIterate == AVERAGE_ITERATE) {
      cupdlp_printf("%27s %+15.8e\n",
		    "Primal objective:", resobj->dPrimalObjAverage);
      cupdlp_printf("%27s %+15.8e\n", "Dual objective:", resobj->dDualObjAverage);
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Primal infeas (abs/rel):", resobj->dPrimalFeasAverage,
		    resobj->dPrimalFeasAverage / (1.0 + scaling->dNormRhs));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Dual infeas (abs/rel):", resobj->dDualFeasAverage,
		    resobj->dDualFeasAverage / (1.0 + scaling->dNormCost));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Duality gap (abs/rel):", fabs(resobj->dDualityGapAverage),
		    resobj->dRelObjGapAverage);
    } else {
      cupdlp_printf("%27s %+15.8e\n", "Primal objective:", resobj->dPrimalObj);
      cupdlp_printf("%27s %+15.8e\n", "Dual objective:", resobj->dDualObj);
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Primal infeas (abs/rel):", resobj->dPrimalFeas,
		    resobj->dPrimalFeas / (1.0 + scaling->dNormRhs));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Dual infeas (abs/rel):", resobj->dDualFeas,
		    resobj->dDualFeas / (1.0 + scaling->dNormCost));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Duality gap (abs/rel):", fabs(resobj->dDualityGap),
		    resobj->dRelObjGap);
    }
    cupdlp_printf("%27s %d\n", "Number of iterations:", timers->nIter);
    cupdlp_printf("\n");
  }

#if PDHG_USE_TIMERS
  if (pdhg->settings->nLogLevel>1) {
    cupdlp_printf("Timing information:\n");
    // cupdlp_printf("%21s %e in %d iterations\n", "Total solver time",
    //               timers->dSolvingTime, timers->nIter);
    cupdlp_printf(
		  "%21s %e in %d iterations\n", "Total solver time",
		  timers->dSolvingTime + timers->dScalingTime + timers->dPresolveTime,
		  timers->nIter);
    cupdlp_printf("%21s %e in %d iterations\n", "Solve time",
		  timers->dSolvingTime, timers->nIter);
    cupdlp_printf("%21s %e \n", "Iters per sec",
		  timers->nIter / timers->dSolvingTime);
    cupdlp_printf("%21s %e\n", "Scaling time", timers->dScalingTime);
    cupdlp_printf("%21s %e\n", "Presolve time", timers->dPresolveTime);
    cupdlp_printf("%21s %e in %d calls\n", "Ax", timers->dAxTime,
		  timers->nAxCalls);
    cupdlp_printf("%21s %e in %d calls\n", "Aty", timers->dAtyTime,
		  timers->nAtyCalls);
    cupdlp_printf("%21s %e in %d calls\n", "ComputeResiduals",
		  timers->dComputeResidualsTime, timers->nComputeResidualsCalls);
    cupdlp_printf("%21s %e in %d calls\n", "UpdateIterates",
		  timers->dUpdateIterateTime, timers->nUpdateIterateCalls);
  }
#endif

#ifndef CUPDLP_CPU
  if (pdhg->settings->nLogLevel>0) {
    cupdlp_printf("\n");
    cupdlp_printf("GPU Timing information:\n");
    cupdlp_printf("%21s %e\n", "CudaPrepare", timers->CudaPrepareTime);
    cupdlp_printf("%21s %e\n", "Alloc&CopyMatToDevice",
		  timers->AllocMem_CopyMatToDeviceTime);
    cupdlp_printf("%21s %e\n", "CopyVecToDevice", timers->CopyVecToDeviceTime);
    cupdlp_printf("%21s %e\n", "DeviceMatVecProd", timers->DeviceMatVecProdTime);
    cupdlp_printf("%21s %e\n\n", "CopyVecToHost", timers->CopyVecToHostTime);
  }
#endif

exit_cleanup:
  return retcode;
}